

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfref.cpp
# Opt level: O1

int __thiscall
CVmObjFrameDesc::getp_get_defobj(CVmObjFrameDesc *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  uint uVar1;
  long *plVar2;
  long lVar3;
  int iVar4;
  vm_obj_id_t *pvVar5;
  vm_obj_id_t vVar6;
  
  if (getp_get_defobj(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    getp_get_defobj();
  }
  iVar4 = CVmObject::get_prop_check_argc(retval,argc,&getp_get_defobj::desc);
  if (iVar4 != 0) {
    return 1;
  }
  uVar1 = *(uint *)(this->super_CVmObject).ext_;
  plVar2 = *(long **)((long)&G_obj_table_X.pages_[uVar1 >> 0xc][uVar1 & 0xfff].ptr_ + 8);
  lVar3 = *plVar2;
  if (lVar3 == 0) {
    pvVar5 = (vm_obj_id_t *)(plVar2 + 7);
  }
  else {
    vVar6 = 0;
    if (*(int *)(lVar3 + -0x90) != 5) goto LAB_002963b0;
    pvVar5 = (vm_obj_id_t *)(lVar3 + -0x88);
  }
  vVar6 = *pvVar5;
LAB_002963b0:
  retval->typ = VM_OBJ;
  (retval->val).obj = vVar6;
  if (vVar6 == 0) {
    retval->typ = VM_NIL;
  }
  return 1;
}

Assistant:

int CVmObjFrameDesc::getp_get_defobj(VMG_ vm_obj_id_t self, vm_val_t *retval,
                                     uint *argc)
{
    /* check arguments */
    static CVmNativeCodeDesc desc(0);
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* get 'definingobj' from the frame */
    get_frame_ref(vmg0_)->get_defobj(vmg_ retval);

    /* handled */
    return TRUE;
}